

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O2

void flesh_two(CHAR_DATA *ch,CHAR_DATA *victim)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  CHAR_DATA *victim_local;
  CHAR_DATA *ch_local;
  string local_48;
  string local_28;
  
  victim_local = victim;
  ch_local = ch;
  if (ch->fighting == (CHAR_DATA *)0x0) {
    act("$n pours blood onto the floor, chanting softly in an undecipherable tongue.",ch,(void *)0x0
        ,(void *)0x0,0);
    act("You pour blood onto the floor, chanting softly in an arcane tongue.",ch,(void *)0x0,
        (void *)0x0,3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"flesh_two",&local_59);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"flesh_three",&local_5a);
    CQueue::AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
              (&RS.Queue,3,&local_28,&local_48,flesh_three,&ch_local,&victim_local);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  else {
    send_to_char("The unholy ritual disrupted, the harnessed energy dissipates harmlessly.\n\r",ch);
    ch->disrupted = true;
  }
  return;
}

Assistant:

void flesh_two(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if (ch->fighting)
	{
		send_to_char("The unholy ritual disrupted, the harnessed energy dissipates harmlessly.\n\r", ch);
		ch->disrupted = true;
		return;
	}

	act("$n pours blood onto the floor, chanting softly in an undecipherable tongue.", ch, 0, 0, TO_ROOM);
	act("You pour blood onto the floor, chanting softly in an arcane tongue.", ch, 0, 0, TO_CHAR);

	RS.Queue.AddToQueue(3, "flesh_two", "flesh_three", flesh_three, ch, victim);
}